

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O3

void __thiscall cfd::core::HashUtil::HashUtil(HashUtil *this,string *hash_type)

{
  uint8_t uVar1;
  pointer pcVar2;
  _Alloc_hider __s1;
  int iVar3;
  ulong uVar4;
  CfdException *pCVar5;
  long lVar6;
  size_t __n;
  string name;
  string local_78;
  ByteData *local_58;
  string local_50;
  
  this->_vptr_HashUtil = (_func_int **)&PTR__HashUtil_007d6c28;
  local_58 = &this->buffer_;
  ByteData::ByteData(local_58);
  if (0x14 < hash_type->_M_string_length) {
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"unsupported hash type.","");
    CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_78);
    __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  pcVar2 = (hash_type->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar2,pcVar2 + hash_type->_M_string_length);
  __s1._M_p = local_78._M_dataplus._M_p;
  if (local_78._M_string_length == 0) {
    __n = 0;
  }
  else {
    uVar4 = 0;
    do {
      if ((byte)(local_78._M_dataplus._M_p[uVar4] + 0xbfU) < 0x1a) {
        local_78._M_dataplus._M_p[uVar4] = local_78._M_dataplus._M_p[uVar4] | 0x20;
      }
      uVar4 = uVar4 + 1;
      __n = local_78._M_string_length;
    } while (uVar4 < local_78._M_string_length);
  }
  lVar6 = 0;
  do {
    uVar1 = (&DAT_0080db90)[lVar6];
    if (uVar1 == '\0') break;
    if ((__n == *(size_t *)((long)&DAT_0080db78 + lVar6)) &&
       ((__n == 0 ||
        (iVar3 = bcmp(__s1._M_p,*(void **)((long)&kFormatList + lVar6),__n), iVar3 == 0)))) {
      this->hash_type_ = uVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)__s1._M_p != &local_78.field_2) {
        operator_delete(__s1._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    lVar6 = lVar6 + 0x28;
  } while (lVar6 != 0xf0);
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"unsupported hash type.","")
  ;
  CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_50);
  __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

HashUtil::HashUtil(const std::string &hash_type) {
  if (hash_type.length() > 20)
    throw CfdException(kCfdIllegalArgumentError, "unsupported hash type.");

  std::string name = hash_type;
  for (size_t index = 0; index < name.length(); ++index) {
    if ((name[index] >= 'A') && (name[index] <= 'Z')) {
      name[index] += 'a' - 'A';
    }
  }
  for (const auto &item : kFormatList) {
    if (item.type == 0) break;
    if (name == item.name) {
      hash_type_ = item.type;
      return;
    }
  }
  throw CfdException(kCfdIllegalArgumentError, "unsupported hash type.");
}